

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net_client.h
# Opt level: O3

void __thiscall blcl::net::client_interface<MsgType>::disconnect(client_interface<MsgType> *this)

{
  connection<MsgType> *this_00;
  impl_type *piVar1;
  reactor *prVar2;
  byte bVar3;
  bool bVar4;
  scoped_lock local_30;
  uint32_t local_1c;
  select_interrupter *local_18;
  
  this_00 = (this->connection_)._M_t.
            super___uniq_ptr_impl<blcl::net::connection<MsgType>,_std::default_delete<blcl::net::connection<MsgType>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_blcl::net::connection<MsgType>_*,_std::default_delete<blcl::net::connection<MsgType>_>_>
            .super__Head_base<0UL,_blcl::net::connection<MsgType>_*,_false>._M_head_impl;
  if ((this_00 != (connection<MsgType> *)0x0) &&
     ((((implementation_type *)
       ((long)&(this_00->socket_).super_basic_socket<asio::ip::tcp,_asio::any_io_executor> + 8))->
      super_base_implementation_type).socket_ != -1)) {
    connection<MsgType>::disconnect(this_00);
  }
  piVar1 = (this->context_).impl_;
  local_30.mutex_ = &piVar1->mutex_;
  bVar3 = (piVar1->mutex_).enabled_;
  bVar4 = (bool)bVar3 == true;
  if (bVar4) {
    pthread_mutex_lock((pthread_mutex_t *)&(piVar1->mutex_).mutex_);
    bVar3 = (piVar1->mutex_).enabled_;
  }
  piVar1->stopped_ = true;
  local_30.locked_ = bVar4;
  if ((bVar3 & 1) != 0) {
    asio::detail::posix_event::signal_all<asio::detail::conditionally_enabled_mutex::scoped_lock>
              (&(piVar1->wakeup_event_).event_,&local_30);
  }
  if ((piVar1->task_interrupted_ == false) && (prVar2 = piVar1->task_, prVar2 != (reactor *)0x0)) {
    piVar1->task_interrupted_ = true;
    local_1c = 0x80000009;
    local_18 = &prVar2->interrupter_;
    epoll_ctl(prVar2->epoll_fd_,3,(prVar2->interrupter_).read_descriptor_,(epoll_event *)&local_1c);
  }
  if (local_30.locked_ == true) {
    pthread_mutex_unlock((pthread_mutex_t *)&(local_30.mutex_)->mutex_);
  }
  if ((this->ctx_thread_)._M_id._M_thread != 0) {
    std::thread::join();
  }
  (this->connection_)._M_t.
  super___uniq_ptr_impl<blcl::net::connection<MsgType>,_std::default_delete<blcl::net::connection<MsgType>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_blcl::net::connection<MsgType>_*,_std::default_delete<blcl::net::connection<MsgType>_>_>
  .super__Head_base<0UL,_blcl::net::connection<MsgType>_*,_false>._M_head_impl =
       (connection<MsgType> *)0x0;
  return;
}

Assistant:

void disconnect() {
            if (is_connected())
                connection_->disconnect();

            context_.stop();
            if (ctx_thread_.joinable())
                ctx_thread_.join();
            connection_.release();
        }